

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

Frag __thiscall re2::Compiler::Cat(Compiler *this,Frag a,Frag b)

{
  Inst *inst0;
  uint32_t p;
  Frag FVar1;
  uint32_t local_58;
  uint32_t uStack_54;
  uint32_t uStack_50;
  uint uStack_4c;
  uint32_t uStack_3c;
  uint32_t uStack_38;
  uint32_t uStack_2c;
  uint32_t local_28;
  
  uStack_2c = a.end.head;
  local_28 = a.end.tail;
  uStack_3c = b.end.head;
  uStack_38 = b.end.tail;
  local_58 = a.begin;
  p = b.begin;
  if (p == 0 || local_58 == 0) {
    FVar1 = NoMatch(this);
    local_58 = FVar1.begin;
    uStack_54 = FVar1.end.head;
    uStack_50 = FVar1.end.tail;
    uStack_4c = CONCAT31(uStack_4c._1_3_,FVar1.nullable);
  }
  else {
    inst0 = (this->inst_).ptr_._M_t.
            super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
            super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
            super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
    if ((((inst0[(int)local_58].out_opcode_ & 7) == 6) && (inst0[(int)local_58].out_opcode_ < 0x10))
       && (local_58 * 2 == uStack_2c)) {
      PatchList::Patch(inst0,a.end,p);
      uStack_4c = b._12_4_;
      local_58 = p;
      uStack_54 = uStack_3c;
      uStack_50 = uStack_38;
    }
    else if (this->reversed_ == true) {
      PatchList::Patch(inst0,b.end,local_58);
      uStack_54 = uStack_2c;
      uStack_50 = local_28;
      uStack_4c = CONCAT31(uStack_4c._1_3_,b.nullable & a.nullable) & 0xffffff01;
      local_58 = p;
    }
    else {
      PatchList::Patch(inst0,a.end,p);
      uStack_54 = uStack_3c;
      uStack_50 = uStack_38;
      uStack_4c = CONCAT31(uStack_4c._1_3_,a.nullable & b.nullable) & 0xffffff01;
    }
  }
  FVar1.end.head = uStack_54;
  FVar1.begin = local_58;
  FVar1.end.tail = uStack_50;
  FVar1._12_4_ = uStack_4c;
  return FVar1;
}

Assistant:

Frag Compiler::Cat(Frag a, Frag b) {
  if (IsNoMatch(a) || IsNoMatch(b))
    return NoMatch();

  // Elide no-op.
  Prog::Inst* begin = &inst_[a.begin];
  if (begin->opcode() == kInstNop &&
      a.end.head == (a.begin << 1) &&
      begin->out() == 0) {
    // in case refs to a somewhere
    PatchList::Patch(inst_.data(), a.end, b.begin);
    return b;
  }

  // To run backward over string, reverse all concatenations.
  if (reversed_) {
    PatchList::Patch(inst_.data(), b.end, a.begin);
    return Frag(b.begin, a.end, b.nullable && a.nullable);
  }

  PatchList::Patch(inst_.data(), a.end, b.begin);
  return Frag(a.begin, b.end, a.nullable && b.nullable);
}